

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O2

void __thiscall Assimp::MDLImporter::SizeCheck(MDLImporter *this,void *szPos)

{
  DeadlyImportError *this_00;
  allocator local_39;
  string local_38;
  
  if ((szPos != (void *)0x0) && (szPos <= this->mBuffer + this->iFileSize)) {
    return;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&local_38,"Invalid MDL file. The file is too small or contains invalid data."
             ,&local_39);
  DeadlyImportError::DeadlyImportError(this_00,&local_38);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MDLImporter::SizeCheck(const void* szPos)
{
    if (!szPos || (const unsigned char*)szPos > this->mBuffer + this->iFileSize)
    {
        throw DeadlyImportError("Invalid MDL file. The file is too small "
            "or contains invalid data.");
    }
}